

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Electron.cpp
# Opt level: O0

void __thiscall
Electron::ConcreteMachine<true>::set_activity_observer
          (ConcreteMachine<true> *this,Observer *observer)

{
  bool bVar1;
  pointer this_00;
  Observer *observer_local;
  ConcreteMachine<true> *this_local;
  
  this->activity_observer_ = observer;
  if (this->activity_observer_ != (Observer *)0x0) {
    (*this->activity_observer_->_vptr_Observer[2])(this->activity_observer_,&this->caps_led,1);
    (*this->activity_observer_->_vptr_Observer[4])
              (this->activity_observer_,&this->caps_led,(ulong)this->caps_led_state_ & 1);
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->plus3_);
  if (bVar1) {
    this_00 = std::unique_ptr<Electron::Plus3,_std::default_delete<Electron::Plus3>_>::operator->
                        (&this->plus3_);
    Plus3::set_activity_observer(this_00,observer);
  }
  SCSI::Bus::set_activity_observer(&this->scsi_bus_,observer);
  return;
}

Assistant:

void set_activity_observer(Activity::Observer *observer) final {
			activity_observer_ = observer;
			if(activity_observer_) {
				activity_observer_->register_led(caps_led, Activity::Observer::LEDPresentation::Persistent);
				activity_observer_->set_led_status(caps_led, caps_led_state_);
			}

			if(plus3_) {
				plus3_->set_activity_observer(observer);
			}

			if(has_scsi_bus) {
				scsi_bus_.set_activity_observer(observer);
			}
		}